

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonASTNode.cpp
# Opt level: O2

void __thiscall CommonASTNode::initialize(CommonASTNode *this,RefToken *t)

{
  uint uVar1;
  string local_30 [32];
  
  uVar1 = (*t->ref->ptr->_vptr_Token[3])();
  (*(this->super_ASTNode)._vptr_ASTNode[8])(this,(ulong)uVar1);
  (*t->ref->ptr->_vptr_Token[2])(local_30);
  (*(this->super_ASTNode)._vptr_ASTNode[7])(this,local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void CommonASTNode::initialize(RefToken t)
{
	setType(t->getType()); setText(t->getText());
}